

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseChunk(xmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  int iVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlGenericErrorFunc p_Var5;
  xmlParserInputBufferPtr pxVar6;
  xmlCharEncodingHandlerPtr pxVar7;
  endDocumentSAXFunc p_Var8;
  xmlParserInputState xVar9;
  int iVar10;
  size_t sVar11;
  size_t sVar12;
  xmlGenericErrorFunc *pp_Var13;
  void **ppvVar14;
  size_t sVar15;
  void *pvVar16;
  xmlChar *pxVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint len;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  int local_5c;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    xVar9 = XML_PARSER_MISC;
  }
  else {
    uVar20 = (ulong)(uint)size;
    xVar9 = ctxt->errNo;
    if (((xVar9 == XML_PARSER_START) || (ctxt->disableSAX != 1)) &&
       (xVar9 = ctxt->instate, xVar9 != XML_PARSER_EOF)) {
      if (xVar9 == XML_PARSER_START) {
        xmlDetectSAX2(ctxt);
      }
      if (terminate == 0 && (chunk != (char *)0x0 && 0 < size)) {
        bVar22 = chunk[uVar20 - 1] == '\r';
        uVar20 = (ulong)(size - (uint)bVar22);
      }
      else {
        bVar22 = false;
      }
      sVar15 = 0;
      sVar12 = 0;
      do {
        len = (uint)uVar20;
        if ((((int)len < 1) || (chunk == (char *)0x0)) ||
           ((pxVar2 = ctxt->input, pxVar2 == (xmlParserInputPtr)0x0 ||
            ((pxVar2->buf == (xmlParserInputBufferPtr)0x0 || (ctxt->instate == XML_PARSER_EOF))))))
        {
          uVar21 = 0;
          uVar20 = uVar21;
          if ((ctxt->instate != XML_PARSER_EOF) &&
             ((pxVar2 = ctxt->input, pxVar2 != (xmlParserInputPtr)0x0 &&
              (pxVar6 = pxVar2->buf, uVar20 = 0, pxVar6 != (xmlParserInputBufferPtr)0x0)))) {
            bVar23 = true;
            if ((pxVar6->encoder != (xmlCharEncodingHandlerPtr)0x0) &&
               ((pxVar6->buffer != (xmlBufPtr)0x0 && (pxVar6->raw != (xmlBufPtr)0x0)))) {
              sVar11 = xmlBufGetInputBase(pxVar6->buffer,pxVar2);
              pxVar3 = ctxt->input->cur;
              pxVar4 = ctxt->input->base;
              iVar10 = xmlCharEncInput(pxVar6,terminate);
              xmlBufSetInputBaseCur(pxVar6->buffer,ctxt->input,sVar11,(long)pxVar3 - (long)pxVar4);
              bVar23 = -1 < iVar10;
              if (!bVar23) {
                pp_Var13 = __xmlGenericError();
                p_Var5 = *pp_Var13;
                ppvVar14 = __xmlGenericErrorContext();
                (*p_Var5)(*ppvVar14,"xmlParseChunk: encoder error\n");
                xmlHaltParser(ctxt);
                local_5c = 0x51;
              }
            }
            uVar20 = uVar21;
            if (!bVar23) {
              return local_5c;
            }
          }
        }
        else {
          sVar11 = xmlBufGetInputBase(pxVar2->buf->buffer,pxVar2);
          pxVar2 = ctxt->input;
          pxVar3 = pxVar2->cur;
          pxVar4 = pxVar2->base;
          sVar12 = xmlBufUse(pxVar2->buf->buffer);
          uVar20 = 0;
          if ((((ctxt->instate == XML_PARSER_START) && (ctxt->input != (xmlParserInputPtr)0x0)) &&
              (pxVar6 = ctxt->input->buf, pxVar6 != (xmlParserInputBufferPtr)0x0)) &&
             (pxVar7 = pxVar6->encoder, uVar20 = 0, pxVar7 != (xmlCharEncodingHandlerPtr)0x0)) {
            pxVar17 = xmlStrcasestr((xmlChar *)pxVar7->name,(xmlChar *)"UTF-16");
            uVar20 = 0x5a;
            if ((pxVar17 == (xmlChar *)0x0) &&
               (pxVar17 = xmlStrcasestr((xmlChar *)ctxt->input->buf->encoder->name,
                                        (xmlChar *)"UTF16"), pxVar17 == (xmlChar *)0x0)) {
              pxVar17 = xmlStrcasestr((xmlChar *)ctxt->input->buf->encoder->name,"UCS-4");
              if ((pxVar17 == (xmlChar *)0x0) &&
                 (pxVar17 = xmlStrcasestr((xmlChar *)ctxt->input->buf->encoder->name,
                                          (xmlChar *)"UCS4"), pxVar17 == (xmlChar *)0x0)) {
                uVar20 = 0x2d;
              }
              else {
                uVar20 = 0xb4;
              }
            }
            uVar21 = ctxt->input->buf->rawconsumed;
            iVar10 = (int)uVar21;
            if (uVar20 <= uVar21) {
              iVar10 = 0;
            }
            uVar19 = (int)uVar20 - iVar10;
            uVar18 = len - uVar19;
            if (len < uVar19) {
              uVar18 = 0;
            }
            uVar20 = (ulong)uVar18;
            if (len >= uVar19) {
              len = uVar19;
            }
          }
          iVar10 = xmlParserInputBufferPush(ctxt->input->buf,len,chunk);
          xmlBufSetInputBaseCur
                    (ctxt->input->buf->buffer,ctxt->input,sVar11,(long)pxVar3 - (long)pxVar4);
          if (iVar10 < 0) {
            ctxt->errNo = -1;
            xmlHaltParser(ctxt);
            return -1;
          }
        }
        iVar10 = 0;
        if ((int)uVar20 == 0) {
          if ((ctxt->input != (xmlParserInputPtr)0x0) &&
             (pxVar6 = ctxt->input->buf, pxVar6 != (xmlParserInputBufferPtr)0x0)) {
            sVar15 = xmlBufUse(pxVar6->buffer);
          }
          iVar10 = terminate;
          if ((sVar15 == 0 || sVar12 == 0) || (10000000 < sVar15 || terminate != 0))
          goto LAB_00168a5e;
          pxVar3 = ctxt->input->base;
          uVar18 = (int)sVar15 - (int)sVar12;
          if (((int)uVar18 < 0 || pxVar3 == (xmlChar *)0x0) ||
             ((((xVar9 = ctxt->instate, xVar9 != XML_PARSER_START_TAG &&
                (iVar1 = ctxt->progressive,
                (xVar9 != XML_PARSER_END_TAG && iVar1 != 2) &&
                (xVar9 != XML_PARSER_CDATA_SECTION && iVar1 != 5))) &&
               (xVar9 != XML_PARSER_DTD && iVar1 != 3)) ||
              (pvVar16 = memchr(pxVar3 + sVar12,0x3e,(ulong)(uVar18 & 0x7fffffff)),
              pvVar16 != (void *)0x0)))) goto LAB_00168a5e;
        }
        else {
LAB_00168a5e:
          xmlParseTryOrFinish(ctxt,iVar10);
        }
        if (ctxt->instate == XML_PARSER_EOF) goto LAB_00168d4f;
        pxVar2 = ctxt->input;
        if (((pxVar2 != (xmlParserInputPtr)0x0) &&
            ((10000000 < (long)pxVar2->end - (long)pxVar2->cur ||
             (10000000 < (long)pxVar2->cur - (long)pxVar2->base)))) &&
           ((ctxt->options & 0x80000) == 0)) {
          xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"Huge input lookup");
          xmlHaltParser(ctxt);
        }
        if ((ctxt->errNo != 0) && (ctxt->disableSAX == 1)) {
          return ctxt->errNo;
        }
        if ((int)uVar20 == 0) {
          if (((bVar22) && (pxVar2 = ctxt->input, pxVar2 != (xmlParserInputPtr)0x0)) &&
             (pxVar2->buf != (xmlParserInputBufferPtr)0x0)) {
            sVar12 = xmlBufGetInputBase(pxVar2->buf->buffer,pxVar2);
            pxVar2 = ctxt->input;
            pxVar3 = pxVar2->cur;
            pxVar4 = pxVar2->base;
            xmlParserInputBufferPush(pxVar2->buf,1,"\r");
            xmlBufSetInputBaseCur
                      (ctxt->input->buf->buffer,ctxt->input,sVar12,(long)pxVar3 - (long)pxVar4);
          }
          if (terminate != 0) {
            pxVar2 = ctxt->input;
            if (pxVar2 == (xmlParserInputPtr)0x0) {
              iVar10 = 0;
            }
            else if (pxVar2->buf == (xmlParserInputBufferPtr)0x0) {
              iVar10 = (*(int *)&pxVar2->base - *(int *)&pxVar2->cur) + pxVar2->length;
            }
            else {
              sVar12 = xmlBufUse(pxVar2->buf->buffer);
              iVar10 = ((int)sVar12 - *(int *)&ctxt->input->cur) + *(int *)&ctxt->input->base;
            }
            if ((ctxt->instate != XML_PARSER_EOF) && (ctxt->instate != XML_PARSER_EPILOG)) {
              xmlFatalErr(ctxt,XML_ERR_DOCUMENT_END,(char *)0x0);
            }
            if ((ctxt->instate == XML_PARSER_EPILOG) && (0 < iVar10)) {
              xmlFatalErr(ctxt,XML_ERR_DOCUMENT_END,(char *)0x0);
            }
            if (((ctxt->instate != XML_PARSER_EOF) && (ctxt->sax != (_xmlSAXHandler *)0x0)) &&
               (p_Var8 = ctxt->sax->endDocument, p_Var8 != (endDocumentSAXFunc)0x0)) {
              (*p_Var8)(ctxt->userData);
            }
            ctxt->instate = XML_PARSER_EOF;
          }
          if (ctxt->wellFormed != 0) {
            return 0;
          }
LAB_00168d4f:
          return ctxt->errNo;
        }
        chunk = chunk + (int)len;
      } while( true );
    }
  }
  return xVar9;
}

Assistant:

int
xmlParseChunk(xmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    int end_in_lf = 0;
    int remain = 0;
    size_t old_avail = 0;
    size_t avail = 0;

    if (ctxt == NULL)
        return(XML_ERR_INTERNAL_ERROR);
    if ((ctxt->errNo != XML_ERR_OK) && (ctxt->disableSAX == 1))
        return(ctxt->errNo);
    if (ctxt->instate == XML_PARSER_EOF)
        return(-1);
    if (ctxt->instate == XML_PARSER_START)
        xmlDetectSAX2(ctxt);
    if ((size > 0) && (chunk != NULL) && (!terminate) &&
        (chunk[size - 1] == '\r')) {
	end_in_lf = 1;
	size--;
    }

xmldecl_done:

    if ((size > 0) && (chunk != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->instate != XML_PARSER_EOF))  {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer, ctxt->input);
	size_t cur = ctxt->input->cur - ctxt->input->base;
	int res;

        old_avail = xmlBufUse(ctxt->input->buf->buffer);
        /*
         * Specific handling if we autodetected an encoding, we should not
         * push more than the first line ... which depend on the encoding
         * And only push the rest once the final encoding was detected
         */
        if ((ctxt->instate == XML_PARSER_START) && (ctxt->input != NULL) &&
            (ctxt->input->buf != NULL) && (ctxt->input->buf->encoder != NULL)) {
            unsigned int len = 45;

            if ((xmlStrcasestr(BAD_CAST ctxt->input->buf->encoder->name,
                               BAD_CAST "UTF-16")) ||
                (xmlStrcasestr(BAD_CAST ctxt->input->buf->encoder->name,
                               BAD_CAST "UTF16")))
                len = 90;
            else if ((xmlStrcasestr(BAD_CAST ctxt->input->buf->encoder->name,
                                    BAD_CAST "UCS-4")) ||
                     (xmlStrcasestr(BAD_CAST ctxt->input->buf->encoder->name,
                                    BAD_CAST "UCS4")))
                len = 180;

            if (ctxt->input->buf->rawconsumed < len)
                len -= ctxt->input->buf->rawconsumed;

            /*
             * Change size for reading the initial declaration only
             * if size is greater than len. Otherwise, memmove in xmlBufferAdd
             * will blindly copy extra bytes from memory.
             */
            if ((unsigned int) size > len) {
                remain = size - len;
                size = len;
            } else {
                remain = 0;
            }
        }
	res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
        xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input, base, cur);
	if (res < 0) {
	    ctxt->errNo = XML_PARSER_EOF;
	    xmlHaltParser(ctxt);
	    return (XML_PARSER_EOF);
	}
#ifdef DEBUG_PUSH
	xmlGenericError(xmlGenericErrorContext, "PP: pushed %d\n", size);
#endif

    } else if (ctxt->instate != XML_PARSER_EOF) {
	if ((ctxt->input != NULL) && ctxt->input->buf != NULL) {
	    xmlParserInputBufferPtr in = ctxt->input->buf;
	    if ((in->encoder != NULL) && (in->buffer != NULL) &&
		    (in->raw != NULL)) {
		int nbchars;
		size_t base = xmlBufGetInputBase(in->buffer, ctxt->input);
		size_t current = ctxt->input->cur - ctxt->input->base;

		nbchars = xmlCharEncInput(in, terminate);
		xmlBufSetInputBaseCur(in->buffer, ctxt->input, base, current);
		if (nbchars < 0) {
		    /* TODO 2.6.0 */
		    xmlGenericError(xmlGenericErrorContext,
				    "xmlParseChunk: encoder error\n");
                    xmlHaltParser(ctxt);
		    return(XML_ERR_INVALID_ENCODING);
		}
	    }
	}
    }
    if (remain != 0) {
        xmlParseTryOrFinish(ctxt, 0);
    } else {
        if ((ctxt->input != NULL) && (ctxt->input->buf != NULL))
            avail = xmlBufUse(ctxt->input->buf->buffer);
        /*
         * Depending on the current state it may not be such
         * a good idea to try parsing if there is nothing in the chunk
         * which would be worth doing a parser state transition and we
         * need to wait for more data
         */
        if ((terminate) || (avail > XML_MAX_TEXT_LENGTH) ||
            (old_avail == 0) || (avail == 0) ||
            (xmlParseCheckTransition(ctxt,
                       (const char *)&ctxt->input->base[old_avail],
                                     avail - old_avail)))
            xmlParseTryOrFinish(ctxt, terminate);
    }
    if (ctxt->instate == XML_PARSER_EOF)
        return(ctxt->errNo);

    if ((ctxt->input != NULL) &&
         (((ctxt->input->end - ctxt->input->cur) > XML_MAX_LOOKUP_LIMIT) ||
         ((ctxt->input->cur - ctxt->input->base) > XML_MAX_LOOKUP_LIMIT)) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
        xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR, "Huge input lookup");
        xmlHaltParser(ctxt);
    }
    if ((ctxt->errNo != XML_ERR_OK) && (ctxt->disableSAX == 1))
        return(ctxt->errNo);

    if (remain != 0) {
        chunk += size;
        size = remain;
        remain = 0;
        goto xmldecl_done;
    }
    if ((end_in_lf == 1) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL)) {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer,
					 ctxt->input);
	size_t current = ctxt->input->cur - ctxt->input->base;

	xmlParserInputBufferPush(ctxt->input->buf, 1, "\r");

	xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input,
			      base, current);
    }
    if (terminate) {
	/*
	 * Check for termination
	 */
	int cur_avail = 0;

	if (ctxt->input != NULL) {
	    if (ctxt->input->buf == NULL)
		cur_avail = ctxt->input->length -
			    (ctxt->input->cur - ctxt->input->base);
	    else
		cur_avail = xmlBufUse(ctxt->input->buf->buffer) -
			              (ctxt->input->cur - ctxt->input->base);
	}

	if ((ctxt->instate != XML_PARSER_EOF) &&
	    (ctxt->instate != XML_PARSER_EPILOG)) {
	    xmlFatalErr(ctxt, XML_ERR_DOCUMENT_END, NULL);
	}
	if ((ctxt->instate == XML_PARSER_EPILOG) && (cur_avail > 0)) {
	    xmlFatalErr(ctxt, XML_ERR_DOCUMENT_END, NULL);
	}
	if (ctxt->instate != XML_PARSER_EOF) {
	    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
		ctxt->sax->endDocument(ctxt->userData);
	}
	ctxt->instate = XML_PARSER_EOF;
    }
    if (ctxt->wellFormed == 0)
	return((xmlParserErrors) ctxt->errNo);
    else
        return(0);
}